

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fprem_x86_64(CPUX86State *env)

{
  float_status *status;
  byte *pbVar1;
  undefined2 uVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  floatx80 fVar9;
  floatx80 a;
  
  status = &env->fp_status;
  fVar9._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  fVar9.low = env->fpregs[env->fpstt].d.low;
  fVar9._12_4_ = 0;
  dVar3 = (double)floatx80_to_float64_x86_64(fVar9,status);
  uVar4 = (ulong)((env->fpstt + 1 & 7) << 4);
  a._8_4_ = *(undefined4 *)((long)env->fpregs + uVar4 + 8);
  a.low = *(undefined8 *)((long)env->fpregs + uVar4);
  a._12_4_ = 0;
  dVar5 = (double)floatx80_to_float64_x86_64(a,status);
  uVar4 = (ulong)env->fpstt;
  if (((ulong)ABS(dVar3) < 0x7ff0000000000000) && (dVar5 != 0.0)) {
    uVar6 = (*(ushort *)((long)env->fpregs + uVar4 * 0x10 + 8) & 0x7fff) -
            (*(ushort *)((long)env->fpregs + (ulong)((env->fpstt + 1 & 7) << 4) + 8) & 0x7fff);
    if (-1 < (int)uVar6) {
      if ((int)uVar6 < 0x35) {
        dVar7 = dVar3 / dVar5;
        if (0.0 <= dVar7) {
          dVar7 = floor(dVar7);
        }
        else {
          dVar7 = ceil(dVar7);
        }
        dVar5 = dVar5 * dVar7;
        dVar8 = -dVar7;
        if (-dVar7 <= dVar7) {
          dVar8 = dVar7;
        }
        uVar2 = env->fpus;
        uVar6 = (uint)(long)dVar8;
        env->fpus = (ushort)((uVar6 & 1) << 9) |
                    (ushort)((uVar6 & 2) << 0xd) | (ushort)((uVar6 & 4) << 6) | uVar2 & 0xb8ff;
      }
      else {
        pbVar1 = (byte *)((long)&env->fpus + 1);
        *pbVar1 = *pbVar1 | 4;
        dVar7 = ldexp(1.0,(uVar6 & 0x7fffffe0) - 0x20);
        dVar8 = (dVar3 / dVar5) / dVar7;
        if (0.0 <= dVar8) {
          dVar8 = floor(dVar8);
        }
        else {
          dVar8 = floor(ABS(dVar8));
          dVar8 = -dVar8;
        }
        dVar5 = dVar8 * dVar5 * dVar7;
      }
      uVar6 = env->fpstt;
      fVar9 = float64_to_floatx80_x86_64((float64)(dVar3 - dVar5),status);
      env->fpregs[uVar6].d.low = fVar9.low;
      *(uint16_t *)((long)env->fpregs + (ulong)uVar6 * 0x10 + 8) = fVar9.high;
      return;
    }
  }
  else {
    fVar9 = float64_to_floatx80_x86_64(0x7ff8000000000000,status);
    env->fpregs[uVar4].d.low = fVar9.low;
    *(uint16_t *)((long)env->fpregs + uVar4 * 0x10 + 8) = fVar9.high;
  }
  pbVar1 = (byte *)((long)&env->fpus + 1);
  *pbVar1 = *pbVar1 & 0xb8;
  return;
}

Assistant:

void helper_fprem(CPUX86State *env)
{
    double st0, st1, dblq, fpsrcop, fptemp;
    CPU_LDoubleU fpsrcop1, fptemp1;
    int expdif;
    signed long long int q;

    st0 = floatx80_to_double(env, ST0);
    st1 = floatx80_to_double(env, ST1);

    if (isinf(st0) || isnan(st0) || isnan(st1) || (st1 == 0.0)) {
        ST0 = double_to_floatx80(env, NAN); /* NaN */
        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        return;
    }

    fpsrcop = st0;
    fptemp = st1;
    fpsrcop1.d = ST0;
    fptemp1.d = ST1;
    expdif = EXPD(fpsrcop1) - EXPD(fptemp1);

    if (expdif < 0) {
        /* optimisation? taken from the AMD docs */
        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        /* ST0 is unchanged */
        return;
    }

    if (expdif < 53) {
        dblq = fpsrcop / fptemp; /* ST0 / ST1 */
        /* round dblq towards zero */
        dblq = (dblq < 0.0) ? ceil(dblq) : floor(dblq);
        st0 = fpsrcop - fptemp * dblq; /* fpsrcop is ST0 */

        /* convert dblq to q by truncating towards zero */
        if (dblq < 0.0) {
            q = (signed long long int)(-dblq);
        } else {
            q = (signed long long int)dblq;
        }

        env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
        /* (C0,C3,C1) <-- (q2,q1,q0) */
        env->fpus |= (q & 0x4) << (8 - 2);  /* (C0) <-- q2 */
        env->fpus |= (q & 0x2) << (14 - 1); /* (C3) <-- q1 */
        env->fpus |= (q & 0x1) << (9 - 0);  /* (C1) <-- q0 */
    } else {
        int N = 32 + (expdif % 32); /* as per AMD docs */

        env->fpus |= 0x400;  /* C2 <-- 1 */
        fptemp = pow(2.0, (double)(expdif - N));
        fpsrcop = (st0 / st1) / fptemp;
        /* fpsrcop = integer obtained by chopping */
        fpsrcop = (fpsrcop < 0.0) ?
                  -(floor(fabs(fpsrcop))) : floor(fpsrcop);
        st0 -= (st1 * fpsrcop * fptemp);
    }
    ST0 = double_to_floatx80(env, st0);
}